

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_alert_batch_query_project.cc
# Opt level: O0

void anon_unknown.dwarf_7b3b::Json2Type(Value *value,AlertBatchQueryProjectResponseType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  AlertBatchQueryProjectResponseType *local_18;
  AlertBatchQueryProjectResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (AlertBatchQueryProjectResponseType *)value;
  bVar1 = Json::Value::isMember(value,"code");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"code");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"message");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"message");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->message,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"success");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"success");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->success,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"traceId");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"traceId");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->trace_id,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"datapoints");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"datapoints");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->datapoints,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"total");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"total");
    Json::Value::asString_abi_cxx11_(&local_d8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->total,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, AlertBatchQueryProjectResponseType* item) {
  if(value.isMember("code")) {
    item->code = value["code"].asString();
  }
  if(value.isMember("message")) {
    item->message = value["message"].asString();
  }
  if(value.isMember("success")) {
    item->success = value["success"].asString();
  }
  if(value.isMember("traceId")) {
    item->trace_id = value["traceId"].asString();
  }
  if(value.isMember("datapoints")) {
    item->datapoints = value["datapoints"].asString();
  }
  if(value.isMember("total")) {
    item->total = value["total"].asString();
  }
}